

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O3

Llb_Mnn_t * Llb_MnnStart(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  void *pvVar1;
  uint uVar2;
  Llb_Mnn_t *p;
  DdManager *unique;
  DdManager *unique_00;
  DdManager *unique_01;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  size_t __nmemb;
  long lVar13;
  
  p = (Llb_Mnn_t *)calloc(1,0xd0);
  p->pInit = pInit;
  p->pAig = pAig;
  p->pPars = pPars;
  ppvVar5 = (void **)0x0;
  unique = Cudd_Init(pAig->vObjs->nSize,0,0x100,0x40000,0);
  p->dd = unique;
  unique_00 = Cudd_Init(pAig->nRegs,0,0x100,0x40000,0);
  p->ddG = unique_00;
  unique_01 = Cudd_Init(pAig->nObjs[2],0,0x100,0x40000,0);
  p->ddR = unique_01;
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_00,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(unique_01,CUDD_REORDER_SYMM_SIFT);
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  p->vRings = pVVar3;
  iVar12 = pAig->nObjs[2];
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar12 - 1U) {
    iVar11 = iVar12;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar11;
  if (iVar11 != 0) {
    ppvVar5 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar3->pArray = ppvVar5;
  p->vLeaves = pVVar3;
  pVVar3 = pAig->vCis;
  if (0 < pVVar3->nSize) {
    lVar13 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar13];
      pVVar3 = p->vLeaves;
      uVar2 = pVVar3->nSize;
      if (uVar2 == pVVar3->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      iVar12 = pVVar3->nSize;
      pVVar3->nSize = iVar12 + 1;
      ppvVar4[iVar12] = pvVar1;
      lVar13 = lVar13 + 1;
      pVVar3 = pAig->vCis;
    } while (lVar13 < pVVar3->nSize);
  }
  iVar12 = pAig->nObjs[3];
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar12 - 1U) {
    iVar11 = iVar12;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar6->pArray = ppvVar4;
  p->vRoots = pVVar6;
  if (0 < pAig->nRegs) {
    iVar12 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar12;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[uVar2];
      pVVar3 = p->vRoots;
      uVar2 = pVVar3->nSize;
      if (uVar2 == pVVar3->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      iVar11 = pVVar3->nSize;
      pVVar3->nSize = iVar11 + 1;
      ppvVar4[iVar11] = pvVar1;
      iVar12 = iVar12 + 1;
    } while (iVar12 < pAig->nRegs);
    pVVar3 = pAig->vCis;
  }
  iVar12 = pAig->vObjs->nSize;
  __nmemb = (size_t)iVar12;
  piVar7 = (int *)calloc(__nmemb,4);
  p->pOrderL = piVar7;
  piVar8 = (int *)calloc(__nmemb,4);
  p->pOrderL2 = piVar8;
  piVar9 = (int *)calloc(__nmemb,4);
  p->pOrderG = piVar9;
  piVar10 = (int *)calloc(__nmemb,4);
  p->pVars2Q = piVar10;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    lVar13 = 0;
    do {
      piVar10[*(int *)((long)ppvVar4[lVar13] + 0x24)] = 1;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar3->nSize);
  }
  if (0 < iVar12) {
    lVar13 = 0;
    do {
      iVar12 = (int)lVar13;
      piVar9[lVar13] = iVar12;
      piVar8[lVar13] = iVar12;
      piVar7[lVar13] = iVar12;
      lVar13 = lVar13 + 1;
    } while (lVar13 < (long)__nmemb);
  }
  Llb_NonlinPrepareVarMap(p);
  return p;
}

Assistant:

Llb_Mnn_t * Llb_MnnStart( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t *  pPars )
{
    Llb_Mnn_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Llb_Mnn_t, 1 );
    p->pInit = pInit;
    p->pAig  = pAig;
    p->pPars = pPars;
    p->dd    = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddG   = Cudd_Init( Aig_ManRegNum(pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR   = Cudd_Init( Aig_ManCiNum(pAig),     0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    p->vRings = Vec_PtrAlloc( 100 );
    // create leaves
    p->vLeaves = Vec_PtrAlloc( Aig_ManCiNum(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_PtrPush( p->vLeaves, pObj );
    // create roots
    p->vRoots = Vec_PtrAlloc( Aig_ManCoNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_PtrPush( p->vRoots, pObj );
    // variables to quantify
    p->pOrderL = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderL2= ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderG = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pVars2Q = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        p->pVars2Q[Aig_ObjId(pObj)] = 1;
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        p->pOrderL[i] = p->pOrderL2[i] = p->pOrderG[i] = i;
    Llb_NonlinPrepareVarMap( p ); 
    return p;
}